

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::File> * __thiscall asl::Array<asl::File>::resize(Array<asl::File> *this,int m)

{
  uint uVar1;
  
  uVar1 = this->_a[-1]._info.flags;
  reserve(this,m);
  if ((int)uVar1 < m) {
    asl_construct<asl::File>(this->_a + (int)uVar1,m - uVar1);
  }
  else if (m < (int)uVar1) {
    asl_destroy<asl::File>(this->_a + m,uVar1 - m);
  }
  this->_a[-1]._info.flags = m;
  return this;
}

Assistant:

Array& resize(int m)
	{
		int n = d().n;
		reserve(m);
		if (m > n)
			asl_construct(_a + n, m - n);
		else if (m < n)
			asl_destroy(_a + m, n - m);
		d().n = m;
		return *this;
	}